

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

size_t crnd::crnd_default_msize(void *p,void *pUser_data)

{
  long in_RDI;
  undefined8 local_18;
  
  if (in_RDI == 0) {
    local_18 = 0;
  }
  else {
    local_18 = malloc_usable_size(in_RDI);
  }
  return local_18;
}

Assistant:

static size_t crnd_default_msize(void* p, void* pUser_data) {
  (void)pUser_data;
#ifdef WIN32
  return p ? _msize(p) : 0;
#elif defined(__APPLE__)
  return p ? malloc_size(p) : 0;
#else
  return p ? malloc_usable_size(p) : 0;
#endif
}